

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyhair2pbrt.cpp
# Opt level: O2

bool __thiscall cyhair::CyHair::Load(CyHair *this,char *filename)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  FILE *__stream;
  size_t sVar6;
  ostream *poVar7;
  uint uVar8;
  undefined4 uVar10;
  char *pcVar9;
  ulong uVar11;
  undefined1 auVar12 [16];
  CyHairHeader header;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  uVar10 = 0;
  sVar6 = fread(&header,0x80,1,__stream);
  if ((sVar6 == 1) && (header.magic == (char  [4])0x52494148)) {
    this->default_thickness_ = header.default_thickness;
    this->default_transparency_ = header.default_transparency;
    *(undefined8 *)this->default_color_ = header.default_color._0_8_;
    this->default_color_[2] = header.default_color[2];
    auVar12._4_4_ = header.flags;
    auVar12._0_4_ = header.flags;
    auVar12._8_4_ = header.flags;
    auVar12._12_4_ = header.flags;
    auVar5._8_4_ = header.flags;
    auVar5._0_4_ = header.num_strands;
    auVar5._4_4_ = header.total_points;
    auVar5._12_4_ = header.default_segments;
    auVar12 = vpand_avx(auVar12,_DAT_00104010);
    uVar4 = vptestnmd_avx512vl(auVar12,auVar12);
    auVar12 = vpshufd_avx(auVar5,0xd2);
    this->flags_ = auVar12._0_4_;
    this->num_strands_ = auVar12._4_4_;
    this->total_points_ = auVar12._8_4_;
    this->default_segments_ = auVar12._12_4_;
    if ((uVar4 & 8) == 0) {
      if (0 < (int)header.default_segments || (header.flags & 1) != 0) {
        if ((header.flags & 1) == 0) {
LAB_00102413:
          poVar7 = std::operator<<((ostream *)&std::cout,"[CyHair] Has points.");
          std::endl<char,std::char_traits<char>>(poVar7);
          std::vector<float,_std::allocator<float>_>::resize
                    (&this->points_,(ulong)(this->total_points_ * 3));
          uVar11 = 1;
          sVar6 = fread((this->points_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)this->total_points_ * 0xc,1,__stream
                       );
          if (sVar6 == 1) {
            if ((uVar4 & 4) == 0) {
              poVar7 = std::operator<<((ostream *)&std::cout,"[CyHair] Has thickness.");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::vector<float,_std::allocator<float>_>::resize
                        (&this->thicknesses_,(ulong)this->total_points_);
              sVar6 = fread((this->thicknesses_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start,(ulong)this->total_points_ << 2
                            ,1,__stream);
              if (sVar6 != 1) {
                pcVar9 = "Failed to read CyHair thickness data.";
                goto LAB_00102663;
              }
            }
            if ((uVar4 & 2) == 0) {
              poVar7 = std::operator<<((ostream *)&std::cout,"[CyHair] Has transparency.");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::vector<float,_std::allocator<float>_>::resize
                        (&this->transparencies_,(ulong)this->total_points_);
              sVar6 = fread((this->transparencies_).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)this->total_points_ << 2,1,
                            __stream);
              if (sVar6 != 1) {
                pcVar9 = "Failed to read CyHair transparencies data.";
                goto LAB_00102663;
              }
            }
            if ((uVar4 & 1) != 0) {
LAB_00102597:
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        (&this->strand_offsets_,(ulong)this->num_strands_);
              puVar1 = (this->strand_offsets_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *puVar1 = 0;
              puVar2 = (this->segments_).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3 = (this->segments_).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (; uVar11 < this->num_strands_; uVar11 = uVar11 + 1) {
                if (puVar2 == puVar3) {
                  uVar8 = this->default_segments_;
                }
                else {
                  uVar8 = (uint)puVar2[uVar11 - 1];
                }
                puVar1[uVar11] = uVar8 + 1 + puVar1[uVar11 - 1];
              }
              return true;
            }
            poVar7 = std::operator<<((ostream *)&std::cout,"[CyHair] Has color.");
            std::endl<char,std::char_traits<char>>(poVar7);
            std::vector<float,_std::allocator<float>_>::resize
                      (&this->colors_,(ulong)(this->total_points_ * 3));
            sVar6 = fread((this->colors_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)this->total_points_ * 0xc,1,
                          __stream);
            if (sVar6 == 1) goto LAB_00102597;
            pcVar9 = "Failed to read CyHair colors data.";
          }
          else {
            pcVar9 = "Failed to read CyHair points data.";
          }
        }
        else {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    (&this->segments_,CONCAT44(uVar10,header.num_strands));
          sVar6 = fread((this->segments_).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)this->num_strands_ * 2,1,__stream);
          if (sVar6 == 1) goto LAB_00102413;
          pcVar9 = "Failed to read CyHair segments data.";
        }
LAB_00102663:
        poVar7 = std::operator<<((ostream *)&std::cout,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00102670;
      }
      pcVar9 = "No valid segment information in CyHair.";
    }
    else {
      pcVar9 = "No point data in CyHair.";
    }
    poVar7 = std::operator<<((ostream *)&std::cout,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
LAB_00102670:
    fclose(__stream);
  }
  return false;
}

Assistant:

bool CyHair::Load(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  assert(sizeof(CyHairHeader) == 128);
  CyHairHeader header;

  if (1 != fread(&header, 128, 1, fp)) {
    fclose(fp);
    return false;
  }
  if (memcmp(header.magic, "HAIR", 4) != 0) {
    fclose(fp);
    return false;
  }

  flags_ = header.flags;
  default_thickness_ = header.default_thickness;
  default_transparency_ = header.default_transparency;
  default_segments_ = static_cast<int>(header.default_segments);
  default_color_[0] = header.default_color[0];
  default_color_[1] = header.default_color[1];
  default_color_[2] = header.default_color[2];

  const bool has_segments = flags_ & 0x1;
  const bool has_points = flags_ & 0x2;
  const bool has_thickness = flags_ & 0x4;
  const bool has_transparency = flags_ & 0x8;
  const bool has_color = flags_ & 0x10;

  num_strands_ = header.num_strands;
  total_points_ = header.total_points;

  if (!has_points) {
    std::cout << "No point data in CyHair." << std::endl;
    return false;
  }

  if ((default_segments_ < 1) && (!has_segments)) {
    std::cout << "No valid segment information in CyHair." << std::endl;
    return false;
  }

  // First read all strand data from a file.
  if (has_segments) {
    segments_.resize(num_strands_);
    if (1 !=
        fread(&segments_[0], sizeof(unsigned short) * num_strands_, 1, fp)) {
      std::cout << "Failed to read CyHair segments data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_points) {
    std::cout << "[CyHair] Has points." << std::endl;
    points_.resize(3 * total_points_);
    size_t n = fread(&points_[0], total_points_ * sizeof(float) * 3, 1, fp);
    if (1 != n) {
      std::cout << "Failed to read CyHair points data." << std::endl;
      fclose(fp);
      return false;
    }
  }
  if (has_thickness) {
    std::cout << "[CyHair] Has thickness." << std::endl;
    thicknesses_.resize(total_points_);
    if (1 != fread(&thicknesses_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair thickness data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_transparency) {
    std::cout << "[CyHair] Has transparency." << std::endl;
    transparencies_.resize(total_points_);
    if (1 != fread(&transparencies_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair transparencies data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_color) {
    std::cout << "[CyHair] Has color." << std::endl;
    colors_.resize(3 * total_points_);
    if (1 != fread(&colors_[0], total_points_ * sizeof(float) * 3, 1, fp)) {
      std::cout << "Failed to read CyHair colors data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  // Build strand offset table.
  strand_offsets_.resize(num_strands_);
  strand_offsets_[0] = 0;
  for (size_t i = 1; i < num_strands_; i++) {
    int num_segments = segments_.empty() ? default_segments_ : segments_[i - 1];
    strand_offsets_[i] =
        strand_offsets_[i - 1] + static_cast<unsigned int>(num_segments + 1);
  }

  return true;
}